

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

void bidiag_orth(double *A,int M,int N,double *U,double *V)

{
  size_t __size;
  int iVar1;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar2;
  int m;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  double alpha;
  double *local_e0;
  double *local_78;
  double local_70;
  int local_34;
  
  if (M < N) {
    printf("M should be greater than or equal to N");
    exit(1);
  }
  uVar13 = (ulong)(uint)N;
  lVar15 = (long)M;
  __size = lVar15 * 8;
  x = (double *)malloc(__size);
  v = (double *)malloc(__size);
  A_00 = (double *)malloc(__size * lVar15);
  C = (double *)malloc(__size * lVar15);
  eye(U,M);
  eye(V,N);
  if (0 < N) {
    uVar16 = (ulong)(uint)M;
    lVar9 = uVar13 << 0x20;
    local_e0 = A + uVar13;
    uVar11 = 0;
    uVar14 = uVar13;
    uVar17 = uVar16;
    lVar5 = lVar9;
    local_78 = A;
    do {
      lVar5 = lVar5 + -0x100000000;
      iVar12 = (int)uVar11;
      if ((long)uVar11 < lVar15) {
        uVar3 = 0;
        pdVar2 = local_78;
        do {
          x[uVar3] = *pdVar2;
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + uVar13;
        } while (uVar17 != uVar3);
        local_34 = M - iVar12;
        local_70 = house(x,local_34,v);
        if ((long)uVar11 < lVar15) {
          lVar4 = 0;
          pdVar2 = local_78;
          uVar3 = uVar11;
          do {
            uVar6 = 0;
            lVar7 = lVar4;
            do {
              *(double *)((long)A_00 + (lVar7 >> 0x1d)) = pdVar2[uVar6];
              lVar7 = lVar7 + (uVar17 << 0x20);
              uVar6 = uVar6 + 1;
            } while (uVar14 != uVar6);
            uVar3 = uVar3 + 1;
            lVar4 = lVar4 + 0x100000000;
            pdVar2 = pdVar2 + uVar13;
          } while (uVar3 != uVar16);
        }
      }
      else {
        local_34 = M - iVar12;
        local_70 = house(x,local_34,v);
      }
      m = N - iVar12;
      mmult(A_00,v,C,m,local_34,1);
      scale(C,N - iVar12,1,local_70);
      mmult(v,C,A_00,local_34,1,m);
      if ((long)uVar11 < lVar15) {
        lVar4 = 0;
        pdVar2 = local_78;
        uVar3 = uVar11;
        do {
          uVar6 = 0;
          lVar7 = lVar4;
          do {
            pdVar2[uVar6] = pdVar2[uVar6] - *(double *)((long)A_00 + (lVar7 >> 0x1d));
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + 0x100000000;
          } while (uVar14 != uVar6);
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + uVar13;
          lVar4 = lVar4 + lVar9;
        } while (uVar3 != uVar16);
      }
      uVar3 = uVar11 + 1;
      if ((long)uVar3 < lVar15) {
        uVar6 = 1;
        pdVar2 = local_e0;
        do {
          *pdVar2 = v[uVar6];
          pdVar2 = pdVar2 + uVar13;
          uVar6 = uVar6 + 1;
        } while (uVar17 != uVar6);
      }
      if ((long)uVar11 < lVar15) {
        iVar1 = 0;
        pdVar2 = U;
        uVar6 = uVar11;
        do {
          uVar10 = 0;
          do {
            A_00[iVar1 + (int)uVar10] = pdVar2[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar17 != uVar10);
          uVar6 = uVar6 + 1;
          pdVar2 = pdVar2 + lVar15;
          iVar1 = iVar1 + local_34;
        } while (uVar6 != uVar16);
        mmult(A_00,v,C,local_34,local_34,1);
        scale(C,local_34,1,local_70);
        mmult(C,v,A_00,local_34,1,local_34);
        if ((long)uVar11 < lVar15) {
          iVar1 = 0;
          pdVar2 = U;
          uVar6 = uVar11;
          do {
            uVar10 = 0;
            do {
              pdVar2[uVar10] = pdVar2[uVar10] - A_00[iVar1 + (int)uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar17 != uVar10);
            uVar6 = uVar6 + 1;
            pdVar2 = pdVar2 + lVar15;
            iVar1 = iVar1 + local_34;
          } while (uVar6 != uVar16);
        }
      }
      else {
        mmult(A_00,v,C,local_34,local_34,1);
        scale(C,local_34,1,local_70);
        mmult(C,v,A_00,local_34,1,local_34);
      }
      if ((long)uVar11 < (long)(N + -2)) {
        lVar4 = uVar11 * (N + 1);
        memcpy(x,(void *)((lVar4 * 8 + 8U & 0x7fffffff8) + (long)A),
               (ulong)(uint)((N + -2) - iVar12) * 8 + 8);
        alpha = house(x,(N - iVar12) + -1,v);
        lVar7 = 0;
        pdVar2 = local_78;
        uVar6 = uVar11;
        do {
          uVar10 = 1;
          lVar8 = lVar7;
          do {
            *(double *)((long)A_00 + (lVar8 >> 0x1d)) = pdVar2[uVar10];
            uVar10 = uVar10 + 1;
            lVar8 = lVar8 + 0x100000000;
          } while (uVar14 != uVar10);
          uVar6 = uVar6 + 1;
          pdVar2 = pdVar2 + uVar13;
          lVar7 = lVar7 + lVar5;
        } while (uVar6 != uVar16);
        mmult(A_00,v,C,local_34,m + -1,1);
        scale(C,local_34,1,alpha);
        mmult(C,v,A_00,local_34,1,m + -1);
        lVar7 = 0;
        pdVar2 = local_78;
        do {
          uVar6 = 1;
          lVar8 = lVar7;
          do {
            pdVar2[uVar6] = pdVar2[uVar6] - *(double *)((long)A_00 + (lVar8 >> 0x1d));
            uVar6 = uVar6 + 1;
            lVar8 = lVar8 + 0x100000000;
          } while (uVar14 != uVar6);
          uVar11 = uVar11 + 1;
          pdVar2 = pdVar2 + uVar13;
          lVar7 = lVar7 + lVar5;
        } while (uVar11 != uVar16);
        memcpy((void *)((lVar4 * 8 + 0x10U & 0x7fffffff8) + (long)A),v + 1,
               (ulong)(uint)((N + -3) - iVar12) * 8 + 8);
      }
      uVar17 = uVar17 - 1;
      local_78 = local_78 + uVar13 + 1;
      uVar14 = uVar14 - 1;
      lVar9 = lVar9 + -0x100000000;
      local_e0 = local_e0 + uVar13 + 1;
      U = U + lVar15 + 1;
      uVar11 = uVar3;
    } while (uVar3 != uVar13);
  }
  free(x);
  free(v);
  free(A_00);
  return;
}

Assistant:

void bidiag_orth(double *A, int M, int N,double *U,double *V) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * M);
	w = (double*) malloc(sizeof(double) * M * M);


	eye(U,M);
	eye(V,N);

	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);
		//mdisplay(v,M-j,1);

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}

		for(i=j+1;i < M;++i) {
			A[i*N+j] = v[i-j];
		}


		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				AT[u+k-j] = U[k+t];
			}
		}

		mmult(AT,v,w,M-j,M-j,1);
		scale(w,M-j,1,beta);
		mmult(w,v,AT,M-j,1,M-j);

		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				U[k+t] -= AT[u+k-j];
			}
		}

		//mdisplay(U,M,M);

		if (j < N - 2) {
			for(i=j+1;i < N;++i) {
				x[i-j-1] = A[j*N+i];
			}
			beta = house(x,N-j-1,v);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					AT[u+k-j-1] = A[k+t];
				}
			}

			mmult(AT,v,w,M-j,N-j-1,1);
			scale(w,M-j,1,beta);
			mmult(w,v,AT,M-j,1,N-j-1);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					A[k+t] -= AT[u+k-j-1];
				}
			}
			u = 1;
			t = j*N;
			for(i = j + 2; i < N;++i) {
				A[t+i] = v[u];
				u++;
			}

		}

	}


	free(x);
	free(v);
	free(AT);

}